

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O0

int arm_debug_target_el(CPUARMState_conflict *env)

{
  _Bool _Var1;
  _Bool _Var2;
  int iVar3;
  bool bVar4;
  _Bool route_to_el2;
  _Bool secure;
  CPUARMState_conflict *env_local;
  
  _Var1 = arm_is_secure(env);
  bVar4 = false;
  iVar3 = arm_feature(env,0x20);
  if (((iVar3 != 0) && (!_Var1)) && (bVar4 = true, ((env->cp15).hcr_el2 & 0x8000000) == 0)) {
    bVar4 = ((env->cp15).mdcr_el2 & 0x100) != 0;
  }
  if (bVar4) {
    env_local._4_4_ = 2;
  }
  else {
    iVar3 = arm_feature(env,0x21);
    if (((iVar3 == 0) || (_Var2 = arm_el_is_aa64(env,3), _Var2)) || (!_Var1)) {
      env_local._4_4_ = 1;
    }
    else {
      env_local._4_4_ = 3;
    }
  }
  return env_local._4_4_;
}

Assistant:

static inline int arm_debug_target_el(CPUARMState *env)
{
    bool secure = arm_is_secure(env);
    bool route_to_el2 = false;

    if (arm_feature(env, ARM_FEATURE_EL2) && !secure) {
        route_to_el2 = env->cp15.hcr_el2 & HCR_TGE ||
                       env->cp15.mdcr_el2 & MDCR_TDE;
    }

    if (route_to_el2) {
        return 2;
    } else if (arm_feature(env, ARM_FEATURE_EL3) &&
               !arm_el_is_aa64(env, 3) && secure) {
        return 3;
    } else {
        return 1;
    }
}